

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_test_registry.hpp
# Opt level: O3

void __thiscall
Catch::
TestInvokerAsMethod<(anonymous_namespace)::CATCH2_INTERNAL_TEMPLATE_TEST_69<slang::SmallVector<(anonymous_namespace)::Constructable,_4UL>_>_>
::invoke(TestInvokerAsMethod<(anonymous_namespace)::CATCH2_INTERNAL_TEMPLATE_TEST_69<slang::SmallVector<(anonymous_namespace)::Constructable,_4UL>_>_>
         *this)

{
  EVP_PKEY_CTX *ctx;
  CATCH2_INTERNAL_TEMPLATE_TEST_69<slang::SmallVector<(anonymous_namespace)::Constructable,_4UL>_>
  obj;
  SmallVectorBase<(anonymous_namespace)::Constructable> local_80;
  SmallVectorBase<(anonymous_namespace)::Constructable> local_48;
  
  ::(anonymous_namespace)::Constructable::numConstructorCalls = 0;
  ::(anonymous_namespace)::Constructable::numMoveConstructorCalls = 0;
  ::(anonymous_namespace)::Constructable::numCopyConstructorCalls = 0;
  ::(anonymous_namespace)::Constructable::numDestructorCalls = 0;
  ::(anonymous_namespace)::Constructable::numAssignmentCalls = 0;
  ::(anonymous_namespace)::Constructable::numMoveAssignmentCalls = 0;
  ::(anonymous_namespace)::Constructable::numCopyAssignmentCalls = 0;
  local_80.data_ = (pointer)local_80.firstElement;
  local_80.len = 0;
  ctx = (EVP_PKEY_CTX *)0x4;
  local_80.cap = 4;
  local_48.data_ = (pointer)local_48.firstElement;
  local_48.len = 0;
  local_48.cap = 4;
  (*(code *)this->m_testAsMethod)(local_80.firstElement + *(long *)&this->field_0x10 + -0x18);
  slang::SmallVectorBase<(anonymous_namespace)::Constructable>::cleanup(&local_48,ctx);
  slang::SmallVectorBase<(anonymous_namespace)::Constructable>::cleanup(&local_80,ctx);
  return;
}

Assistant:

void invoke() const override {
        C obj;
        (obj.*m_testAsMethod)();
    }